

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffgiszll(fitsfile *fptr,int nlen,LONGLONG *naxes,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
    goto LAB_00143e16;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  if (pFVar1->hdutype == 0) {
    if (pFVar1->imgdim < nlen) {
      nlen = pFVar1->imgdim;
    }
    if (0 < nlen) {
      uVar3 = 0;
      do {
        naxes[uVar3] = pFVar1->imgnaxis[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)nlen != uVar3);
    }
  }
  else if (pFVar1->compressimg == 0) {
    *status = 0xe9;
  }
  else {
    if (pFVar1->zndim < nlen) {
      nlen = pFVar1->zndim;
    }
    if (0 < nlen) {
      uVar3 = 0;
      do {
        naxes[uVar3] = pFVar1->znaxis[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)nlen != uVar3);
    }
  }
LAB_00143e16:
  return *status;
}

Assistant:

int ffgiszll( fitsfile *fptr,  /* I - FITS file pointer                     */
            int nlen,          /* I - number of axes to return              */
            LONGLONG  *naxes,  /* O - size of image dimensions              */
            int  *status)      /* IO - error status                         */
/*
  Get the size of the image dimensions (= NAXISn keywords for normal image, or
  ZNAXISn for a compressed image)
*/
{
    int ii, naxis;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        naxis = minvalue((fptr->Fptr)->imgdim, nlen);
        for (ii = 0; ii < naxis; ii++)
        {
            naxes[ii] = (fptr->Fptr)->imgnaxis[ii];
        }
    }
    else if ((fptr->Fptr)->compressimg)
    {
        naxis = minvalue( (fptr->Fptr)->zndim, nlen);
        for (ii = 0; ii < naxis; ii++)
        {
            naxes[ii] = (fptr->Fptr)->znaxis[ii];
        }
    }
    else
    {
        *status = NOT_IMAGE;
    }

    return(*status);
}